

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkSetUserData(void *arkode_mem,void *user_data)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetUserData","arkode_mem = NULL illegal.");
  }
  else {
    *(void **)((long)arkode_mem + 0x10) = user_data;
    if (*(int *)((long)arkode_mem + 0x54) != 0) {
      *(void **)((long)arkode_mem + 0x60) = user_data;
    }
    if (*(int *)((long)arkode_mem + 0x68) != 0) {
      *(void **)((long)arkode_mem + 0x78) = user_data;
    }
    if (*(long *)((long)arkode_mem + 0x280) != 0) {
      *(void **)(*(long *)((long)arkode_mem + 0x280) + 0x80) = user_data;
    }
    iVar1 = 0;
    if (*(long *)((long)arkode_mem + 0x288) != 0) {
      *(void **)((long)arkode_mem + 0x290) = user_data;
    }
  }
  return iVar1;
}

Assistant:

int arkSetUserData(void *arkode_mem, void *user_data)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetUserData", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  ark_mem->user_data = user_data;

  /* Set data for efun */
  if (ark_mem->user_efun)
    ark_mem->e_data = user_data;

  /* Set data for rfun */
  if (ark_mem->user_rfun)
    ark_mem->r_data = user_data;

  /* Set data for root finding */
  if (ark_mem->root_mem != NULL)
    ark_mem->root_mem->root_data = user_data;

  /* Set data for post-processing a step */
  if (ark_mem->ProcessStep != NULL)
    ark_mem->ps_data = user_data;

  return(ARK_SUCCESS);
}